

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O3

ScalarFunctionSet * duckdb::TruncFun::GetFunctions(void)

{
  LogicalType varargs;
  InternalException *this;
  code *__f;
  ScalarFunctionSet *in_RDI;
  code *bind;
  LogicalType *other;
  initializer_list<duckdb::LogicalType> __l;
  scalar_function_t func;
  undefined4 in_stack_fffffffffffffda4;
  undefined4 in_stack_fffffffffffffdac;
  FunctionNullHandling in_stack_fffffffffffffdb8;
  allocator_type local_241;
  string local_238;
  _func_int **local_218;
  vector<duckdb::ScalarFunction,_true> *local_210;
  LogicalType *local_208;
  LogicalType *local_200;
  LogicalType *local_1f8;
  _Any_data local_1e8;
  code *local_1d8;
  undefined8 uStack_1d0;
  LogicalType local_1c0;
  vector<duckdb::LogicalType,_true> local_1a8;
  _Any_data local_190;
  code *local_180;
  LogicalType local_170;
  ScalarFunction local_158;
  
  ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  LogicalType::Numeric();
  local_208 = local_1f8;
  if (local_200 != local_1f8) {
    local_210 = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
    local_218 = (_func_int **)&PTR__ScalarFunction_019684c8;
    other = local_200;
    do {
      local_1d8 = (code *)0x0;
      uStack_1d0 = 0;
      local_1e8._M_unused._M_object = (void *)0x0;
      local_1e8._8_8_ = 0;
      __f = ScalarFunction::UnaryFunction<float,float,duckdb::TruncOperator>;
      bind = BindGenericRoundFunctionDecimal<duckdb::TruncDecimalOperator>;
      switch(other->id_) {
      case DATE:
      case TIME:
      case TIMESTAMP_SEC:
      case TIMESTAMP_MS:
      case TIMESTAMP:
      case TIMESTAMP_NS:
      case CHAR:
      case VARCHAR:
      case BLOB:
      case INTERVAL:
switchD_00fc5666_caseD_f:
        this = (InternalException *)__cxa_allocate_exception(0x10);
        local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"Unimplemented numeric type for function \"trunc\"","");
        InternalException::InternalException(this,&local_238);
        __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      case DECIMAL:
        goto switchD_00fc5666_caseD_15;
      case FLOAT:
        break;
      case DOUBLE:
        __f = ScalarFunction::UnaryFunction<double,double,duckdb::TruncOperator>;
        break;
      default:
        if (1 < other->id_ - 0x31) goto switchD_00fc5666_caseD_f;
      case TINYINT:
      case SMALLINT:
      case INTEGER:
      case BIGINT:
      case UTINYINT:
      case USMALLINT:
      case UINTEGER:
      case UBIGINT:
        __f = ScalarFunction::NopFunction;
      }
      ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
                ((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
                 local_1e8._M_pod_data,__f);
      bind = (bind_scalar_function_t)0x0;
switchD_00fc5666_caseD_15:
      LogicalType::LogicalType((LogicalType *)&local_238,other);
      __l._M_len = 1;
      __l._M_array = (iterator)&local_238;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_1a8,__l
                 ,&local_241);
      LogicalType::LogicalType(&local_1c0,other);
      ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
      function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
               &local_190,
               (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
               &local_1e8);
      LogicalType::LogicalType(&local_170,INVALID);
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
      varargs._0_8_ = &local_170;
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
           in_stack_fffffffffffffda4;
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
           = 0;
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
           = in_stack_fffffffffffffdac;
      ScalarFunction::ScalarFunction
                (&local_158,&local_1a8,&local_1c0,(scalar_function_t *)&local_190,bind,
                 (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
                 (init_local_state_t)0x0,varargs,CONSISTENT,in_stack_fffffffffffffdb8,
                 (bind_lambda_function_t)in_RDI);
      ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
      emplace_back<duckdb::ScalarFunction>
                (&local_210->
                  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
                 &local_158);
      local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           local_218;
      if (local_158.function_info.internal.
          super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_158.function_info.internal.
                   super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_158.function.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_158.function.super__Function_base._M_manager)
                  ((_Any_data *)&local_158.function,(_Any_data *)&local_158.function,
                   __destroy_functor);
      }
      BaseScalarFunction::~BaseScalarFunction(&local_158.super_BaseScalarFunction);
      LogicalType::~LogicalType(&local_170);
      if (local_180 != (code *)0x0) {
        (*local_180)(&local_190,&local_190,__destroy_functor);
      }
      LogicalType::~LogicalType(&local_1c0);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_1a8);
      LogicalType::~LogicalType((LogicalType *)&local_238);
      if (local_1d8 != (code *)0x0) {
        (*local_1d8)(&local_1e8,&local_1e8,__destroy_functor);
      }
      other = other + 1;
    } while (other != local_208);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_200);
  return in_RDI;
}

Assistant:

ScalarFunctionSet TruncFun::GetFunctions() {
	ScalarFunctionSet trunc;
	for (auto &type : LogicalType::Numeric()) {
		scalar_function_t func = nullptr;
		bind_scalar_function_t bind_func = nullptr;
		//	Truncation of integers gets generated by some tools (e.g., Tableau/JDBC:Postgres)
		switch (type.id()) {
		case LogicalTypeId::FLOAT:
			func = ScalarFunction::UnaryFunction<float, float, TruncOperator>;
			break;
		case LogicalTypeId::DOUBLE:
			func = ScalarFunction::UnaryFunction<double, double, TruncOperator>;
			break;
		case LogicalTypeId::DECIMAL:
			bind_func = BindGenericRoundFunctionDecimal<TruncDecimalOperator>;
			break;
		case LogicalTypeId::TINYINT:
		case LogicalTypeId::SMALLINT:
		case LogicalTypeId::INTEGER:
		case LogicalTypeId::BIGINT:
		case LogicalTypeId::HUGEINT:
		case LogicalTypeId::UTINYINT:
		case LogicalTypeId::USMALLINT:
		case LogicalTypeId::UINTEGER:
		case LogicalTypeId::UBIGINT:
		case LogicalTypeId::UHUGEINT:
			func = ScalarFunction::NopFunction;
			break;
		default:
			throw InternalException("Unimplemented numeric type for function \"trunc\"");
		}
		trunc.AddFunction(ScalarFunction({type}, type, func, bind_func));
	}
	return trunc;
}